

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O0

string * __thiscall
cmExtraSublimeTextGenerator::ComputeFlagsForObject_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraSublimeTextGenerator *this,cmSourceFile *source,
          cmLocalGenerator *lg,cmGeneratorTarget *gtgt)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  cmMakefile *this_01;
  ulong uVar1;
  char *pcVar2;
  allocator local_141;
  string local_140;
  allocator local_119;
  string local_118;
  undefined1 local_f8 [8];
  string includeFlags;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string local_b8;
  string local_98;
  string *local_78;
  string *config;
  string language;
  cmMakefile *makefile;
  cmGeneratorTarget *gtgt_local;
  cmLocalGenerator *lg_local;
  cmSourceFile *source_local;
  cmExtraSublimeTextGenerator *this_local;
  string *flags;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  this_01 = cmLocalGenerator::GetMakefile(lg);
  cmSourceFile::GetLanguage_abi_cxx11_((string *)&config,source);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    std::__cxx11::string::operator=((string *)&config,"C");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b8,"CMAKE_BUILD_TYPE",
             (allocator *)
             ((long)&includes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pcVar2 = cmMakefile::GetSafeDefinition(this_01,&local_b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_98,pcVar2,
             (allocator *)
             ((long)&includes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&includes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&includes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_78 = &local_98;
  cmLocalGenerator::AddLanguageFlags(lg,__return_storage_ptr__,(string *)&config,local_78);
  cmLocalGenerator::AddArchitectureFlags(lg,__return_storage_ptr__,gtgt,(string *)&config,local_78);
  cmLocalGenerator::AddCMP0018Flags(lg,__return_storage_ptr__,gtgt,(string *)&config,local_78);
  this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&includeFlags.field_2 + 8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(this_00);
  cmLocalGenerator::GetIncludeDirectories(lg,this_00,gtgt,(string *)&config,local_78,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_118,"",&local_119);
  cmLocalGenerator::GetIncludeFlags
            ((string *)local_f8,lg,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&includeFlags.field_2 + 8),gtgt,(string *)&config,true,false,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  (*lg->_vptr_cmLocalGenerator[5])(lg,__return_storage_ptr__,local_f8);
  std::__cxx11::string::~string((string *)local_f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&includeFlags.field_2 + 8));
  pcVar2 = cmMakefile::GetDefineFlags(this_01);
  (*lg->_vptr_cmLocalGenerator[6])(lg,__return_storage_ptr__,pcVar2);
  cmLocalGenerator::AddCompileOptions(lg,__return_storage_ptr__,gtgt,(string *)&config,local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_140,"COMPILE_FLAGS",&local_141);
  pcVar2 = cmSourceFile::GetProperty(source,&local_140);
  (*lg->_vptr_cmLocalGenerator[6])(lg,__return_storage_ptr__,pcVar2);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&config);
  return __return_storage_ptr__;
}

Assistant:

std::string
cmExtraSublimeTextGenerator::ComputeFlagsForObject(cmSourceFile* source,
                                                   cmLocalGenerator* lg,
                                                   cmGeneratorTarget* gtgt)
{
  std::string flags;

  cmMakefile *makefile = lg->GetMakefile();
  std::string language = source->GetLanguage();
  if (language.empty())
   {
   language = "C";
   }
  const std::string& config = makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
  // Add language-specific flags.
  lg->AddLanguageFlags(flags, language, config);

  lg->AddArchitectureFlags(flags, gtgt, language, config);

  // TODO: Fortran support.
  // // Fortran-specific flags computed for this target.
  // if(*l == "Fortran")
  //   {
  //   this->AddFortranFlags(flags);
  //   }

  // Add shared-library flags if needed.
  lg->AddCMP0018Flags(flags, gtgt, language, config);

  // Add include directory flags.
  {
  std::vector<std::string> includes;
  lg->GetIncludeDirectories(includes, gtgt, language, config);
  std::string includeFlags =
    lg->GetIncludeFlags(includes, gtgt, language, true); // full include paths
  lg->AppendFlags(flags, includeFlags);
  }

  // Append old-style preprocessor definition flags.
  lg->AppendFlags(flags, makefile->GetDefineFlags());

  // Add target-specific flags.
  lg->AddCompileOptions(flags, gtgt, language, config);

  // Add source file specific flags.
  lg->AppendFlags(flags, source->GetProperty("COMPILE_FLAGS"));

  // TODO: Handle Apple frameworks.

  return flags;
}